

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false>::
visit<slang::ast::AttributeSymbol>
          (ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false> *this,AttributeSymbol *t)

{
  AttributeSymbol *t_local;
  ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false> *this_local;
  
  DiagnosticVisitor::handle<slang::ast::AttributeSymbol>((DiagnosticVisitor *)this,t);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (is_detected_v<handle_t, TDerived, T>)
            static_cast<TDerived*>(this)->handle(t);
        else if constexpr (is_detected_v<op_t, TDerived, T>)
            (DERIVED)(t);
        else
            visitDefault(t);
    }